

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_212ecc1::Impl::startProcessingMessages(Impl *this,ClosedHandler *onClose)

{
  bool bVar1;
  type local_68;
  thread local_60 [3];
  type local_48;
  thread local_20;
  function<void_()> *local_18;
  ClosedHandler *onClose_local;
  Impl *this_local;
  
  local_18 = onClose;
  onClose_local = (ClosedHandler *)this;
  bVar1 = std::atomic<bool>::exchange(&this->isProcessingMessages,true,memory_order_seq_cst);
  if (bVar1) {
    EventHandlers::error(&this->handlers,"Session::startProcessingMessages() called twice");
  }
  else {
    local_48.this = this;
    std::function<void_()>::function(&local_48.onClose,local_18);
    std::thread::
    thread<(anonymous_namespace)::Impl::startProcessingMessages(std::function<void()>const&)::_lambda()_1_,,void>
              (&local_20,&local_48);
    std::thread::operator=(&this->recvThread,&local_20);
    std::thread::~thread(&local_20);
    (anonymous_namespace)::Impl::startProcessingMessages(std::function<void()>const&)::{lambda()#1}
    ::~function((_lambda___1_ *)&local_48);
    local_68.this = this;
    std::thread::
    thread<(anonymous_namespace)::Impl::startProcessingMessages(std::function<void()>const&)::_lambda()_2_,,void>
              (local_60,&local_68);
    std::thread::operator=(&this->dispatchThread,local_60);
    std::thread::~thread(local_60);
  }
  return;
}

Assistant:

void startProcessingMessages(
      const ClosedHandler& onClose /* = {} */) override {
    if (isProcessingMessages.exchange(true)) {
      handlers.error("Session::startProcessingMessages() called twice");
      return;
    }
    recvThread = std::thread([this, onClose] {
      while (reader.isOpen()) {
        if (auto payload = getPayload()) {
          inbox.put(std::move(payload));
        }
      }
      if (onClose) {
        onClose();
      }
    });

    dispatchThread = std::thread([this] {
      while (auto payload = inbox.take()) {
        payload.value()();
      }
    });
  }